

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

void __thiscall
KDIS::NETWORK::Connection::Connection
          (Connection *this,KString *SendAddress,KUINT32 Port,KBOOL SendAddressIsMulticast,
          KBOOL Blocking,PDU_Factory *Custom,KBOOL SendOnly)

{
  this->_vptr_Connection = (_func_int **)&PTR__Connection_00214b80;
  this->m_uiPort = Port;
  (this->m_sSendAddress)._M_dataplus._M_p = (pointer)&(this->m_sSendAddress).field_2;
  (this->m_sSendAddress)._M_string_length = 0;
  (this->m_sSendAddress).field_2._M_local_buf[0] = '\0';
  this->m_bBlockingSocket = Blocking;
  this->m_bSendOnly = SendOnly;
  (this->m_vpSubscribers).
  super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpSubscribers).
  super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vpSubscribers).
  super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  KDataStream::KDataStream(&this->m_stream,Big_Endian);
  (this->m_sLastIP)._M_dataplus._M_p = (pointer)&(this->m_sLastIP).field_2;
  (this->m_sLastIP)._M_string_length = 0;
  (this->m_sLastIP).field_2._M_local_buf[0] = '\0';
  this->m_iSocket[0] = 0;
  this->m_iSocket[1] = 0;
  (this->m_blockingTimeout).tv_sec = 0;
  (this->m_blockingTimeout).tv_usec = 0;
  startup(this);
  (*this->_vptr_Connection[2])(this,SendAddress,(ulong)SendAddressIsMulticast);
  (*this->_vptr_Connection[6])(this,(ulong)Blocking);
  if (Custom == (PDU_Factory *)0x0) {
    Custom = (PDU_Factory *)operator_new(0x20);
    UTILS::PDU_Factory::PDU_Factory(Custom);
  }
  this->m_pPduFact = Custom;
  return;
}

Assistant:

Connection::Connection( const KString & SendAddress, KUINT32 Port /* = 3000 */, KBOOL SendAddressIsMulticast /* = false */,
                        KBOOL Blocking /* = true */, PDU_Factory * Custom /* = 0 */, KBOOL SendOnly /* = false*/) :
    m_uiPort( Port ),
    m_bBlockingSocket( Blocking ),
    m_bSendOnly( SendOnly )
{
    m_iSocket[SEND_SOCK] = 0;
    m_iSocket[RECEIVE_SOCK] = 0;

    m_blockingTimeout.tv_sec = 0;
    m_blockingTimeout.tv_usec = 0;

    startup();

    SetSendAddress( SendAddress, SendAddressIsMulticast );

    SetBlockingModeEnabled( Blocking );

    // Should we use the standard PDU_Factory or have we been supplied we a customised one?
    if( Custom )
    {
        m_pPduFact = Custom;
    }
    else
    {
        m_pPduFact = new PDU_Factory;
    }
}